

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint _h;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  int *piVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  undefined8 *puVar24;
  int iVar25;
  int nn;
  Mat local_88;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar17 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_38 = (ulong)(uint)top_blob->c;
  local_88.cstep = 0;
  local_88.elemsize = 0;
  local_88.elempack = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  uVar21 = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar17 < 2) {
    uVar21 = uVar2;
  }
  Mat::create(&local_88,iVar3 << (1 < (long)uVar17),_h,uVar21,8,8,opt->workspace_allocator);
  if (0 < (int)uVar2 >> 1) {
    lVar15 = 0;
    uVar18 = 0;
    do {
      if (0 < (int)_h) {
        puVar22 = (undefined8 *)(local_88.cstep * uVar18 * local_88.elemsize + (long)local_88.data);
        uVar23 = 0;
        do {
          if (0 < iVar3) {
            puVar24 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar15);
            iVar25 = iVar3;
            do {
              uVar12 = puVar24[1];
              *puVar22 = *puVar24;
              puVar22[1] = uVar12;
              puVar22 = puVar22 + 2;
              puVar24 = puVar24 + uVar17;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != _h);
      }
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar18 != (uint)((int)uVar2 >> 1));
  }
  uVar18 = uVar17 & 0xfffffffffffffffe;
  if ((uint)uVar18 != uVar2) {
    pvVar16 = (void *)(uVar18 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)_h) {
        uVar21 = ((uint)(uVar18 >> 0x1f) & 1) + (int)uVar18;
        puVar22 = (undefined8 *)
                  ((long)(int)(((int)uVar21 >> 1) + ((int)uVar18 - (uVar21 & 0xfffffffe))) *
                   local_88.cstep * local_88.elemsize + (long)local_88.data);
        uVar23 = 0;
        do {
          if (0 < iVar3) {
            puVar24 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + (long)pvVar16);
            iVar25 = iVar3;
            do {
              *puVar22 = *puVar24;
              puVar22 = puVar22 + 1;
              puVar24 = puVar24 + uVar17;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != _h);
      }
      uVar18 = uVar18 + 1;
      pvVar16 = (void *)((long)pvVar16 + 8);
    } while ((long)uVar18 < (long)uVar17);
  }
  if (0 < (int)local_38) {
    uVar18 = 0;
    do {
      pauVar14 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 2) {
        uVar23 = 0;
      }
      else {
        lVar15 = 0;
        uVar19 = 0;
        do {
          if (0 < (int)(iVar3 * _h)) {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar18 * kernel->elemsize + (long)kernel->data);
            auVar1 = *(undefined1 (*) [16])
                      (local_88.cstep * local_88.elemsize * lVar15 + (long)local_88.data);
            auVar4 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar4);
            vpunpckhbw_avx(auVar1,auVar4);
            auVar1 = *pauVar14;
            auVar4 = pauVar14[1];
            auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar4);
            vpunpcklbw_avx(auVar1,auVar5);
            vpunpckhbw_avx(auVar1,auVar5);
            vpunpcklbw_avx(auVar4,auVar6);
            vpunpckhbw_avx(auVar4,auVar6);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar4 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpcklqdq_avx(auVar1,auVar8);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar8);
          auVar1 = vpaddd_avx(auVar11,auVar1);
          auVar8 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpaddd_avx(auVar4,auVar8);
          auVar1 = vpaddd_avx(auVar1,auVar4);
          auVar5 = vpunpcklqdq_avx(auVar9,auVar10);
          auVar4 = vpunpckhqdq_avx(auVar9,auVar10);
          auVar4 = vpaddd_avx(auVar5,auVar4);
          auVar8 = vpunpcklqdq_avx(auVar6,auVar7);
          auVar5 = vpunpckhqdq_avx(auVar6,auVar7);
          auVar5 = vpaddd_avx(auVar5,auVar8);
          auVar4 = vpaddd_avx(auVar4,auVar5);
          *pauVar14 = auVar1;
          pauVar14[1] = auVar4;
          pauVar14 = pauVar14 + 2;
          uVar23 = uVar19 + 2;
          lVar20 = uVar19 + 3;
          lVar15 = lVar15 + 1;
          uVar19 = uVar23;
        } while (lVar20 < (long)uVar17);
      }
      if ((int)uVar23 < (int)uVar2) {
        do {
          if (0 < (int)(iVar3 * _h)) {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar18 * kernel->elemsize + (long)kernel->data);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(local_88.cstep * local_88.elemsize *
                                      (ulong)(((uint)uVar23 & 1) +
                                             ((uint)(uVar23 >> 1) & 0x7fffffff)) +
                                     (long)local_88.data);
            vpmovsxbw_avx(auVar1);
            auVar1 = *pauVar14;
            auVar4 = pauVar14[1];
            auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar4);
            vpunpcklbw_avx(auVar1,auVar5);
            vpunpckhbw_avx(auVar1,auVar5);
            vpunpcklbw_avx(auVar4,auVar6);
            vpunpckhbw_avx(auVar4,auVar6);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar4 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpcklqdq_avx(auVar1,auVar6);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar6);
          auVar1 = vpaddd_avx(auVar7,auVar1);
          auVar6 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpaddd_avx(auVar4,auVar6);
          auVar1 = vpaddd_avx(auVar1,auVar4);
          *pauVar14 = auVar1;
          pauVar14 = pauVar14 + 1;
          uVar21 = (uint)uVar23 + 1;
          uVar23 = (ulong)uVar21;
        } while (uVar21 != uVar2);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_38);
  }
  piVar13 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}